

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_should_not_parse_to_deeply_nested_jsons(void)

{
  size_t sVar1;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  char deep_json [1001];
  char acStack_408 [1000];
  undefined1 local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  memset(acStack_408,0x5b,0x3e9);
  local_20 = 0;
  sVar1 = strlen(acStack_408);
  pcVar2 = cJSON_ParseWithLengthOpts(acStack_408,sVar1 + 1,(char **)0x0,0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail("To deep JSONs should not be parsed.",0xdb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_should_not_parse_to_deeply_nested_jsons(void)
{
    char deep_json[CJSON_NESTING_LIMIT + 1];
    size_t position = 0;

    for (position = 0; position < sizeof(deep_json); position++)
    {
        deep_json[position] = '[';
    }
    deep_json[sizeof(deep_json) - 1] = '\0';

    TEST_ASSERT_NULL_MESSAGE(cJSON_Parse(deep_json), "To deep JSONs should not be parsed.");
}